

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_container_free(ly_ctx *ctx,lys_node_container *cont,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_24;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_container *cont_local;
  ly_ctx *ctx_local;
  
  lydict_remove(ctx,cont->presence);
  for (local_24 = 0; local_24 < (int)(uint)cont->tpdf_size; local_24 = local_24 + 1) {
    lys_tpdf_free(ctx,cont->tpdf + local_24,private_destructor);
  }
  free(cont->tpdf);
  for (local_24 = 0; local_24 < (int)(uint)cont->must_size; local_24 = local_24 + 1) {
    lys_restr_free(ctx,cont->must + local_24,private_destructor);
  }
  free(cont->must);
  lys_when_free(ctx,cont->when,private_destructor);
  return;
}

Assistant:

static void
lys_container_free(struct ly_ctx *ctx, struct lys_node_container *cont,
                   void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    /* handle only specific parts for LY_NODE_CONTAINER */
    lydict_remove(ctx, cont->presence);

    for (i = 0; i < cont->tpdf_size; i++) {
        lys_tpdf_free(ctx, &cont->tpdf[i], private_destructor);
    }
    free(cont->tpdf);

    for (i = 0; i < cont->must_size; i++) {
        lys_restr_free(ctx, &cont->must[i], private_destructor);
    }
    free(cont->must);

    lys_when_free(ctx, cont->when, private_destructor);
}